

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O2

void sylvan_serialize_fromfile(FILE *in)

{
  uint64_t uVar1;
  size_t sVar2;
  BDD low;
  BDD high;
  sylvan_ser *data;
  ulong uVar3;
  int local_64;
  FILE *local_60;
  size_t count;
  sylvan_ser s;
  mtbddnode node;
  
  uVar3 = 1;
  local_60 = (FILE *)in;
  sVar2 = fread(&count,8,1,(FILE *)in);
  if (sVar2 == 1) {
    while( true ) {
      if (count < uVar3) {
        return;
      }
      sVar2 = fread(&node,0x10,1,local_60);
      uVar1 = node.b;
      if (sVar2 != 1) break;
      low = sylvan_serialize_get_reversed(node.b & 0xffffffffff);
      high = sylvan_serialize_get_reversed(node.a & 0x800000ffffffffff);
      s.bdd = mtbdd_makenode((__atomic_base<unsigned_int>)(__int_type)(uVar1 >> 0x28),low,high);
      local_64 = 0;
      sylvan_ser_done = sylvan_ser_done + 1;
      data = &s;
      s.assigned = sylvan_ser_done;
      sylvan_ser_put(&sylvan_ser_set,&s,&local_64);
      sylvan_ser_reversed_insert((avl_node_t **)&s,data);
      uVar3 = uVar3 + 1;
    }
  }
  puts("sylvan_serialize_fromfile: file format error, giving up");
  exit(-1);
}

Assistant:

void
sylvan_serialize_fromfile(FILE *in)
{
    size_t count, i;
    if (fread(&count, sizeof(size_t), 1, in) != 1) {
        // TODO FIXME return error
        printf("sylvan_serialize_fromfile: file format error, giving up\n");
        exit(-1);
    }

    for (i=1; i<=count; i++) {
        struct bddnode node;
        if (fread(&node, sizeof(struct bddnode), 1, in) != 1) {
            // TODO FIXME return error
            printf("sylvan_serialize_fromfile: file format error, giving up\n");
            exit(-1);
        }

        BDD low = sylvan_serialize_get_reversed(bddnode_getlow(&node));
        BDD high = sylvan_serialize_get_reversed(bddnode_gethigh(&node));

        struct sylvan_ser s;
        s.bdd = sylvan_makenode(bddnode_getvariable(&node), low, high);
        s.assigned = ++sylvan_ser_done; // starts at 0 but we want 1-based...

        sylvan_ser_insert(&sylvan_ser_set, &s);
        sylvan_ser_reversed_insert(&sylvan_ser_reversed_set, &s);
    }
}